

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

bool __thiscall
miniply::PLYReader::load_binary_scalar_property_big_endian
          (PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  ushort *puVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  pointer puVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar4 = *destIndex;
  bVar7 = load_binary_scalar_property(this,prop,destIndex);
  if (bVar7) {
    puVar5 = (this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *(int *)(kPLYPropertySize + (ulong)prop->type * 4);
    if (iVar2 == 8) {
      uVar6 = *(ulong *)(puVar5 + sVar4);
      *(ulong *)(puVar5 + sVar4) =
           uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    }
    else if (iVar2 == 4) {
      uVar3 = *(uint *)(puVar5 + sVar4);
      *(uint *)(puVar5 + sVar4) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
    else if (iVar2 == 2) {
      puVar1 = (ushort *)(puVar5 + sVar4);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    }
  }
  return bVar7;
}

Assistant:

bool PLYReader::load_binary_scalar_property_big_endian(PLYProperty &prop, size_t &destIndex)
  {
    size_t startIndex = destIndex;
    if (load_binary_scalar_property(prop, destIndex)) {
      endian_swap(m_elementData.data() + startIndex, prop.type);
      return true;
    }
    else {
      return false;
    }
  }